

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

mbedtls_md_type_t
mbedtls_ssl_sig_hash_set_find(mbedtls_ssl_sig_hash_set_t *set,mbedtls_pk_type_t sig_alg)

{
  if (sig_alg != MBEDTLS_PK_RSA) {
    if (sig_alg != MBEDTLS_PK_ECDSA) {
      return MBEDTLS_MD_NONE;
    }
    set = (mbedtls_ssl_sig_hash_set_t *)&set->ecdsa;
  }
  return set->rsa;
}

Assistant:

mbedtls_md_type_t mbedtls_ssl_sig_hash_set_find( mbedtls_ssl_sig_hash_set_t *set,
                                                 mbedtls_pk_type_t sig_alg )
{
    switch( sig_alg )
    {
        case MBEDTLS_PK_RSA:
            return( set->rsa );
        case MBEDTLS_PK_ECDSA:
            return( set->ecdsa );
        default:
            return( MBEDTLS_MD_NONE );
    }
}